

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O0

void MainWindowDetails::Proc
               (Display *param_1,Window *param_2,XEvent e,Size2D *size,bool *isResizing)

{
  undefined1 auVar1 [188];
  undefined4 x;
  undefined4 y;
  undefined1 local_80 [8];
  XConfigureEvent re;
  bool *isResizing_local;
  Size2D *size_local;
  Window *param_1_local;
  Display *param_0_local;
  
  auVar1 = e._4_188_;
  e._4_188_ = auVar1;
  re._80_8_ = isResizing;
  switch(e.type) {
  case 4:
    switch(e.xkey.keycode) {
    case 1:
      ProcRelay::mouse_left_down((ProcRelay *)relay);
      break;
    case 2:
      ProcRelay::mouse_middle_down((ProcRelay *)relay);
      break;
    case 3:
      ProcRelay::mouse_right_down((ProcRelay *)relay);
      break;
    case 4:
      ProcRelay::mouse_z((ProcRelay *)relay,1);
      break;
    case 5:
      ProcRelay::mouse_z((ProcRelay *)relay,-1);
    }
    break;
  case 5:
    if (e.xkey.keycode == 1) {
      ProcRelay::mouse_left_up((ProcRelay *)relay);
    }
    else if (e.xkey.keycode == 2) {
      ProcRelay::mouse_middle_up((ProcRelay *)relay);
    }
    else if (e.xkey.keycode == 3) {
      ProcRelay::mouse_right_up((ProcRelay *)relay);
    }
    break;
  case 6:
    x = e.xkey.x;
    y = e.xkey.y;
    ProcRelay::mouse_xy((ProcRelay *)relay,x,y);
    break;
  case 7:
    break;
  case 8:
    break;
  case 0xc:
    std::function<void_()>::operator()((function<void_()> *)(relay + 0x18));
    break;
  case 0x16:
    memcpy(local_80,&e,0x58);
    if ((size->w != re.x) || (size->h != re.y)) {
      *(undefined1 *)re._80_8_ = 1;
      std::function<void_(int,_int,_StateChange)>::operator()
                ((function<void_(int,_int,_StateChange)> *)(relay + 0x38),re.x,re.y,Resized);
    }
    break;
  case 0x17:
    break;
  case 0x19:
  }
  return;
}

Assistant:

static void Proc(Display* /*display*/, Window& /*handle*/, XEvent e, Size2D const& size, bool& isResizing)
	{
		switch(e.type)
		{
		case MotionNotify: relay.mouse_xy(e.xbutton.x, e.xbutton.y); break;
		case EnterNotify:  break;
		case LeaveNotify:  break;
		case ButtonPress:
		{
			switch(e.xbutton.button)
			{
			case 1: relay.mouse_left_down();   break;
			case 2: relay.mouse_middle_down(); break;
			case 3: relay.mouse_right_down();  break;
			case 4: relay.mouse_z(1);          break;
			case 5: relay.mouse_z(-1);         break;
			}
			break;
		}
		case ButtonRelease:
		{
			switch(e.xbutton.button)
			{
			case 1: relay.mouse_left_up();   break;
			case 2: relay.mouse_middle_up(); break;
			case 3: relay.mouse_right_up();  break;
				//case 4: relay.mouse_z(1);          break;//?
				//case 5: relay.mouse_z(-1)          break;//?
			}
			break;
		}
		case ResizeRequest:
		{
			//XResizeRequestEvent re = e.xresizerequest;
			//printf("RR\n");
			break;
		}
		case ConfigureRequest:
		{
			//XConfigureRequestEvent re = e.xconfigurerequest;
			//printf("CR\n");
			break;
		}
		case ConfigureNotify:
		{
			XConfigureEvent re = e.xconfigure;
			if( size.w == re.width && size.h == re.height )
			{
				//printf("CN Move %i %i\n", re.x, re.y);
				//XMoveWindow(display, handle, 0, 0);
			}//move only
			else
			{
				isResizing = true;
				//printf("CN Resize %i %i\n", re.width, re.height);
				relay.onResize(re.width, re.height, StateChange::Resized);
			}
			break;
		}
		//CM handled outside.
		case Expose: relay.onRender(); break;
		}
	}